

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int markbuffer(int f,int n)

{
  int iVar1;
  int n_local;
  int f_local;
  
  iVar1 = gotoeob(f,n);
  if (iVar1 == 0) {
    n_local = 0;
  }
  else {
    clearmark(f,n);
    iVar1 = gotobob(f,n);
    if (iVar1 == 0) {
      n_local = 0;
    }
    else {
      n_local = 1;
    }
  }
  return n_local;
}

Assistant:

int
markbuffer(int f, int n)
{
	if (gotoeob(f,n) == FALSE)
		return (FALSE);
	(void) clearmark(f, n);
	if (gotobob(f,n) == FALSE)
		return (FALSE);
	return (TRUE);
}